

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-hmac-impl.c
# Opt level: O0

int ndn_lite_default_hmacprng
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t output_size,
              uint8_t *seed_value,uint32_t seed_size,uint8_t *additional_value,
              uint32_t additional_size)

{
  int iVar1;
  uint8_t local_198 [8];
  uint8_t min_seed [32];
  tc_hmac_prng_struct h;
  uint32_t seed_size_local;
  uint8_t *seed_value_local;
  uint32_t output_size_local;
  uint8_t *output_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  iVar1 = tc_hmac_prng_init((TCHmacPrng_t)(min_seed + 0x18),input_value,input_size);
  if (iVar1 != 1) {
    return -0x1c;
  }
  if (seed_size < 0x20) {
    memset(local_198,0,0x20);
    memcpy(local_198,seed_value,(ulong)seed_size);
    iVar1 = tc_hmac_prng_reseed((TCHmacPrng_t)(min_seed + 0x18),local_198,0x20,additional_value,
                                additional_size);
    if (iVar1 != 1) {
      return -0x1c;
    }
    iVar1 = tc_hmac_prng_generate(output_value,output_size,(TCHmacPrng_t)(min_seed + 0x18));
    if (iVar1 != 1) {
      return -0x19;
    }
  }
  else {
    iVar1 = tc_hmac_prng_reseed((TCHmacPrng_t)(min_seed + 0x18),seed_value,seed_size,
                                additional_value,additional_size);
    if (iVar1 != 1) {
      return -0x1c;
    }
    iVar1 = tc_hmac_prng_generate(output_value,output_size,(TCHmacPrng_t)(min_seed + 0x18));
    if (iVar1 != 1) {
      return -0x19;
    }
  }
  return 0;
}

Assistant:

int
ndn_lite_default_hmacprng(const uint8_t* input_value, uint32_t input_size,
                          uint8_t* output_value, uint32_t output_size,
                          const uint8_t* seed_value, uint32_t seed_size,
                          const uint8_t* additional_value, uint32_t additional_size)
{
  struct tc_hmac_prng_struct h;
  if (tc_hmac_prng_init(&h, input_value, input_size) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_INIT_FAILURE;
  }

  if (seed_size < 32) {
    uint8_t min_seed[32] = {0};
    memcpy(min_seed, seed_value, seed_size);
    if (tc_hmac_prng_reseed(&h, min_seed, sizeof(min_seed),
                            additional_value, additional_size) != TC_CRYPTO_SUCCESS) {
      return NDN_SEC_INIT_FAILURE;
    }
    if (tc_hmac_prng_generate(output_value, output_size, &h) != TC_CRYPTO_SUCCESS) {
      return NDN_SEC_CRYPTO_ALGO_FAILURE;
    }
  }
  else {
    if (tc_hmac_prng_reseed(&h, seed_value, seed_size,
                            additional_value, additional_size) != TC_CRYPTO_SUCCESS) {
      return NDN_SEC_INIT_FAILURE;
    }
    if (tc_hmac_prng_generate(output_value, output_size, &h) != TC_CRYPTO_SUCCESS) {
      return NDN_SEC_CRYPTO_ALGO_FAILURE;
    }
  }
  return NDN_SUCCESS;
}